

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall
re2::RE2::DoMatch(RE2 *this,StringPiece *text,Anchor re_anchor,size_t *consumed,Arg **args,int n)

{
  bool bVar1;
  char cVar2;
  LogMessage *submatch;
  long lVar3;
  uint nsubmatch;
  StringPiece stkvec [17];
  LogMessage *local_1d8;
  LogMessage local_1b8;
  
  if (this->error_code_ == NoError) {
    if (n <= this->num_captures_) {
      submatch = &local_1b8;
      local_1d8 = (LogMessage *)0x0;
      memset(submatch,0,0x110);
      nsubmatch = n + 1U;
      if (n == 0) {
        nsubmatch = 0;
      }
      if (consumed != (size_t *)0x0) {
        nsubmatch = n + 1U;
      }
      if (0x11 < (int)nsubmatch) {
        submatch = (LogMessage *)operator_new__((ulong)nsubmatch << 4);
        memset(submatch,0,(ulong)nsubmatch << 4);
        local_1d8 = submatch;
      }
      bVar1 = Match(this,text,0,text->size_,re_anchor,(StringPiece *)submatch,nsubmatch);
      if (bVar1) {
        if (consumed != (size_t *)0x0) {
          *consumed = (*(long *)&submatch->flushed_ + *(long *)&submatch->str_) - (long)text->data_;
        }
        if ((args != (Arg **)0x0 && n != 0) && (0 < n)) {
          lVar3 = 0;
          do {
            cVar2 = (*(code *)(*(undefined8 **)((long)args + lVar3))[1])
                              (*(undefined8 *)(&submatch->field_0x10 + lVar3 * 2),
                               *(undefined8 *)(&submatch->field_0x18 + lVar3 * 2),
                               **(undefined8 **)((long)args + lVar3));
            if (cVar2 == '\0') {
              if (local_1d8 == (LogMessage *)0x0) {
                return false;
              }
              operator_delete__(local_1d8);
              return false;
            }
            lVar3 = lVar3 + 8;
          } while ((ulong)(uint)n << 3 != lVar3);
        }
        if (local_1d8 == (LogMessage *)0x0) {
          return true;
        }
      }
      else if (local_1d8 == (LogMessage *)0x0) {
        return false;
      }
      operator_delete__(local_1d8);
      return bVar1;
    }
  }
  else if ((this->options_).log_errors_ == true) {
    LogMessage::LogMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
               ,799);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.str_,"Invalid RE2: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.str_,(this->error_->_M_dataplus)._M_p,
               this->error_->_M_string_length);
    LogMessage::~LogMessage(&local_1b8);
  }
  return false;
}

Assistant:

bool RE2::DoMatch(const StringPiece& text,
                  Anchor re_anchor,
                  size_t* consumed,
                  const Arg* const* args,
                  int n) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (NumberOfCapturingGroups() < n) {
    // RE has fewer capturing groups than number of Arg pointers passed in.
    return false;
  }

  // Count number of capture groups needed.
  int nvec;
  if (n == 0 && consumed == NULL)
    nvec = 0;
  else
    nvec = n+1;

  StringPiece* vec;
  StringPiece stkvec[kVecSize];
  StringPiece* heapvec = NULL;

  if (nvec <= static_cast<int>(arraysize(stkvec))) {
    vec = stkvec;
  } else {
    vec = new StringPiece[nvec];
    heapvec = vec;
  }

  if (!Match(text, 0, text.size(), re_anchor, vec, nvec)) {
    delete[] heapvec;
    return false;
  }

  if (consumed != NULL)
    *consumed = static_cast<size_t>(vec[0].end() - text.begin());

  if (n == 0 || args == NULL) {
    // We are not interested in results
    delete[] heapvec;
    return true;
  }

  // If we got here, we must have matched the whole pattern.
  for (int i = 0; i < n; i++) {
    const StringPiece& s = vec[i+1];
    if (!args[i]->Parse(s.data(), s.size())) {
      // TODO: Should we indicate what the error was?
      delete[] heapvec;
      return false;
    }
  }

  delete[] heapvec;
  return true;
}